

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_facade.cpp
# Opt level: O0

string * __thiscall
license::hw_identifier::HwIdentifierFacade::generate_user_pc_signature_abi_cxx11_
          (string *__return_storage_ptr__,HwIdentifierFacade *this,
          LCC_API_HW_IDENTIFICATION_STRATEGY strategy)

{
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar1;
  int __val;
  char *__nptr;
  int *piVar2;
  pointer pIVar3;
  logic_error *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_6c;
  undefined1 local_68 [4];
  FUNCTION_RETURN result;
  HwIdentifier pc_id;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  strategy_ptr;
  int strategy_int;
  char *env_var_value;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  strategies_to_try;
  bool use_env_var;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_local;
  
  strategies_to_try.
  super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (LCC_API_HW_IDENTIFICATION_STRATEGY)this;
  strategies_to_try.
  super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>::
  vector((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
          *)&env_var_value);
  if (((strategies_to_try.
        super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == STRATEGY_DEFAULT) &&
      (__nptr = getenv("IDENTIFICATION_STRATEGY"), __nptr != (char *)0x0)) && (*__nptr != '\0')) {
    LVar1 = atoi(__nptr);
    if ((LVar1 < STRATEGY_ETHERNET) || (STRATEGY_CPU_SIZE < LVar1)) {
      piVar2 = __errno_location();
      __x = extraout_XMM0_Qa;
      if (*piVar2 != 0) {
        piVar2 = __errno_location();
        strerror(*piVar2);
        __x = extraout_XMM0_Qa_00;
      }
      _log(__x);
    }
    else {
      strategies_to_try.
      super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      strategies_to_try.
      super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = LVar1;
    }
  }
  IdentificationStrategy::get_strategy
            ((IdentificationStrategy *)&pc_id.m_data,
             strategies_to_try.
             super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  HwIdentifier::HwIdentifier((HwIdentifier *)local_68);
  pIVar3 = std::
           unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
           ::operator->((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                         *)&pc_id.m_data);
  local_6c = (*pIVar3->_vptr_IdentificationStrategy[3])(pIVar3,local_68);
  HwIdentifier::set_use_environment_var
            ((HwIdentifier *)local_68,
             (bool)(strategies_to_try.
                    super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1));
  if (local_6c == 0) {
    HwIdentifier::print_abi_cxx11_(__return_storage_ptr__,(HwIdentifier *)local_68);
    HwIdentifier::~HwIdentifier((HwIdentifier *)local_68);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::~unique_ptr((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                   *)&pc_id.m_data);
    std::
    vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
    ::~vector((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
               *)&env_var_value);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  pIVar3 = std::
           unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
           ::operator->((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                         *)&pc_id.m_data);
  __val = (*pIVar3->_vptr_IdentificationStrategy[2])();
  std::__cxx11::to_string(&local_d0,__val);
  std::operator+(&local_b0,"strategy ",&local_d0);
  std::operator+(&local_90,&local_b0," failed");
  std::logic_error::logic_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string HwIdentifierFacade::generate_user_pc_signature(LCC_API_HW_IDENTIFICATION_STRATEGY strategy) {
	bool use_env_var = false;
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategies_to_try;
	if (strategy == STRATEGY_DEFAULT) {
		char* env_var_value = getenv(LCC_IDENTIFICATION_STRATEGY_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			int strategy_int = atoi(env_var_value);
			if (strategy_int < 0 || strategy_int > 3) {
				LOG_WARN("unknown " LCC_IDENTIFICATION_STRATEGY_ENV_VAR " %s", env_var_value);
			} else {
				strategy = (LCC_API_HW_IDENTIFICATION_STRATEGY)strategy_int;
				use_env_var = true;
			}
		}
	}

	unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strategy);
	HwIdentifier pc_id;
	FUNCTION_RETURN result = strategy_ptr->generate_pc_id(pc_id);
	pc_id.set_use_environment_var(use_env_var);
	if (result != FUNC_RET_OK) {
		throw logic_error("strategy " + to_string(strategy_ptr->identification_strategy()) + " failed");
	}
	return pc_id.print();
}